

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O3

void mahjong::adjust_by_suits(tile_t *tiles,intptr_t tile_cnt,fan_table_t *fan_table)

{
  tile_t *ptVar1;
  byte bVar2;
  long lVar3;
  tile_t *ptVar4;
  uint16_t uVar5;
  tile_t *ptVar6;
  long lVar7;
  
  if (tile_cnt < 1) {
    bVar2 = 0;
LAB_0011de03:
    (*fan_table)[0x4c] = 1;
    lVar3 = 0x16;
  }
  else {
    lVar3 = 0;
    bVar2 = 0;
    do {
      bVar2 = bVar2 | (byte)(1 << (tiles[lVar3] >> 4));
      lVar3 = lVar3 + 1;
    } while (tile_cnt != lVar3);
    lVar3 = 0x31;
    if ((bVar2 & 0xf1) == 0) goto LAB_0011de03;
  }
  if ((bVar2 & 0xe3) == 0) {
    (*fan_table)[0x4b] = (*fan_table)[0x4b] + 1;
  }
  if ((bVar2 & 0xe5) == 0) {
    (*fan_table)[0x4b] = (*fan_table)[0x4b] + 1;
  }
  uVar5 = (*fan_table)[0x4b];
  if ((bVar2 & 0xe9) == 0) {
    uVar5 = uVar5 + 1;
    (*fan_table)[0x4b] = uVar5;
  }
  if (uVar5 == 2) {
    (*fan_table)[0x4b] = 0;
    (*fan_table)[lVar3] = 1;
  }
  if (bVar2 != 0x1e) {
    return;
  }
  ptVar1 = tiles + tile_cnt;
  lVar3 = tile_cnt >> 2;
  ptVar4 = tiles;
  if (0 < lVar3) {
    ptVar4 = tiles + (tile_cnt & 0xfffffffffffffffc);
    lVar7 = lVar3 + 1;
    ptVar6 = tiles + 3;
    do {
      if ((byte)(ptVar6[-3] + 0xbf) < 4) {
        ptVar6 = ptVar6 + -3;
        goto LAB_0011df33;
      }
      if ((byte)(ptVar6[-2] + 0xbf) < 4) {
        ptVar6 = ptVar6 + -2;
        goto LAB_0011df33;
      }
      if ((byte)(ptVar6[-1] + 0xbf) < 4) {
        ptVar6 = ptVar6 + -1;
        goto LAB_0011df33;
      }
      if ((byte)(*ptVar6 + 0xbf) < 4) goto LAB_0011df33;
      lVar7 = lVar7 + -1;
      ptVar6 = ptVar6 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)ptVar1 - (long)ptVar4;
  if (lVar7 == 1) {
LAB_0011df1f:
    ptVar6 = ptVar4;
    if (3 < (byte)(*ptVar4 + 0xbf)) {
      return;
    }
  }
  else if (lVar7 == 2) {
LAB_0011def9:
    ptVar6 = ptVar4;
    if (3 < (byte)(*ptVar4 + 0xbf)) {
      ptVar4 = ptVar4 + 1;
      goto LAB_0011df1f;
    }
  }
  else {
    if (lVar7 != 3) {
      return;
    }
    ptVar6 = ptVar4;
    if (3 < (byte)(*ptVar4 + 0xbf)) {
      ptVar4 = ptVar4 + 1;
      goto LAB_0011def9;
    }
  }
LAB_0011df33:
  if (ptVar6 == ptVar1) {
    return;
  }
  ptVar4 = tiles;
  if (0 < lVar3) {
    ptVar4 = tiles + (tile_cnt & 0xfffffffffffffffc);
    lVar3 = lVar3 + 1;
    ptVar6 = tiles + 3;
    do {
      if ((byte)(ptVar6[-3] + 0xbb) < 3) {
        ptVar6 = ptVar6 + -3;
        goto LAB_0011dfe2;
      }
      if ((byte)(ptVar6[-2] + 0xbb) < 3) {
        ptVar6 = ptVar6 + -2;
        goto LAB_0011dfe2;
      }
      if ((byte)(ptVar6[-1] + 0xbb) < 3) {
        ptVar6 = ptVar6 + -1;
        goto LAB_0011dfe2;
      }
      if ((byte)(*ptVar6 + 0xbb) < 3) goto LAB_0011dfe2;
      lVar3 = lVar3 + -1;
      ptVar6 = ptVar6 + 4;
    } while (1 < lVar3);
  }
  lVar3 = (long)ptVar1 - (long)ptVar4;
  ptVar6 = ptVar4;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      if (lVar3 != 3) {
        return;
      }
      if ((byte)(*ptVar4 + 0xbb) < 3) goto LAB_0011dfe2;
      ptVar6 = ptVar4 + 1;
    }
    if ((byte)(*ptVar6 + 0xbb) < 3) goto LAB_0011dfe2;
    ptVar6 = ptVar6 + 1;
  }
  if (2 < (byte)(*ptVar6 + 0xbb)) {
    return;
  }
LAB_0011dfe2:
  if (ptVar6 == ptVar1) {
    return;
  }
  (*fan_table)[0x33] = 1;
  return;
}

Assistant:

static void adjust_by_suits(const tile_t *tiles, intptr_t tile_cnt, fan_table_t &fan_table) {
    // 打表标记有哪些花色，用bit操作
    uint8_t suit_flag = 0;
    for (intptr_t i = 0; i < tile_cnt; ++i) {
        suit_flag |= (1 << tile_get_suit(tiles[i]));
    }

    // 1111 0001
    if (!(suit_flag & 0xF1U)) {
        fan_table[NO_HONORS] = 1;  // 无字
    }

    // 1110 0011
    if (!(suit_flag & 0xE3U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（万）
    }
    // 1110 0101
    if (!(suit_flag & 0xE5U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（条）
    }
    // 1110 1001
    if (!(suit_flag & 0xE9U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（饼）
    }

    // 当缺2门时，根据有字和无字，修正为混一色和清一色
    if (fan_table[ONE_VOIDED_SUIT] == 2) {
        fan_table[ONE_VOIDED_SUIT] = 0;
        fan_table[suit_flag & 0xF1U ? HALF_FLUSH : FULL_FLUSH] = 1;
    }

    // 0001 1110
    if (suit_flag == 0x1EU) {  // 三门数牌和字牌都有
        if (std::any_of(tiles, tiles + tile_cnt, &is_winds)
            && std::any_of(tiles, tiles + tile_cnt, &is_dragons)) {
            fan_table[ALL_TYPES] = 1;  // 五门齐
        }
    }
}